

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O3

bool __thiscall
google::protobuf::internal::ReflectionSchema::IsFieldInlined
          (ReflectionSchema *this,FieldDescriptor *field)

{
  long lVar1;
  long *plVar2;
  byte bVar3;
  bool bVar4;
  once_flag *__once;
  FieldDescriptor *local_20;
  _func_void_FieldDescriptor_ptr *local_18;
  
  lVar1 = *(long *)(field + 0x58);
  if (lVar1 == 0) {
    if (field[0x42] == (FieldDescriptor)0x0) {
      plVar2 = (long *)(*(long *)(field + 0x50) + 0x28);
    }
    else if (*(long *)(field + 0x60) == 0) {
      plVar2 = (long *)(*(long *)(field + 0x28) + 0x80);
    }
    else {
      plVar2 = (long *)(*(long *)(field + 0x60) + 0x50);
    }
    bVar3 = (byte)this->offsets_[(int)((ulong)((long)field - *plVar2) >> 3) * 0x286bca1b];
    __once = *(once_flag **)(field + 0x30);
  }
  else {
    __once = *(once_flag **)(field + 0x30);
    bVar3 = (byte)this->offsets_
                  [(long)((int)((ulong)(lVar1 - *(long *)(*(long *)(lVar1 + 0x10) + 0x30)) >> 4) *
                         -0x55555555) + (long)*(int *)(*(long *)(field + 0x50) + 0x68)];
  }
  if (__once != (once_flag *)0x0) {
    local_18 = FieldDescriptor::TypeOnceInit;
    local_20 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (__once,&local_18,&local_20);
  }
  if ((*(int *)(field + 0x38) == 0xc) || (*(int *)(field + 0x38) == 9)) {
    bVar4 = (bool)(bVar3 & 1);
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool IsFieldInlined(const FieldDescriptor* field) const {
    if (field->containing_oneof()) {
      size_t offset =
          static_cast<size_t>(field->containing_type()->field_count() +
                              field->containing_oneof()->index());
      return Inlined(offsets_[offset], field->type());
    } else {
      return Inlined(offsets_[field->index()], field->type());
    }
  }